

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

optional<Token> * __thiscall
Tokenizer::nextToken(optional<Token> *__return_storage_ptr__,Tokenizer *this)

{
  _Arg _Var1;
  unsigned_long uVar2;
  ushort uVar3;
  _Storage<char,_true> _Var4;
  optional<char> oVar5;
  int iVar6;
  TokenType TVar7;
  iterator iVar8;
  int *piVar9;
  ulong uVar10;
  long *plVar11;
  string *psVar12;
  undefined8 uVar13;
  uint uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  uint uVar16;
  _Arg __arg;
  bool bVar17;
  pair<unsigned_long,_unsigned_long> pVar18;
  out_of_range anon_var_0;
  _Arg __arg_4;
  stringstream ss;
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_448;
  code *local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  int local_424;
  _Arg local_420;
  any local_418;
  any local_408;
  any local_3f8;
  any local_3e8;
  code *local_3d8;
  _Storage local_3d0;
  code *local_3c8;
  _Storage local_3c0;
  code *local_3b8;
  _Storage local_3b0;
  code *local_3a8;
  _Storage local_3a0 [9];
  string local_358 [3];
  string local_2f8 [3];
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [80];
  undefined1 *local_238;
  long local_230;
  undefined1 local_228 [16];
  undefined7 *local_218;
  undefined8 local_210;
  undefined7 local_208;
  undefined1 uStack_201;
  undefined7 uStack_200;
  undefined1 local_1f9;
  undefined7 *local_1f8;
  undefined8 local_1f0;
  undefined7 local_1e8;
  undefined1 uStack_1e1;
  undefined7 uStack_1e0;
  undefined1 local_1d9;
  undefined7 *local_1d8;
  undefined8 local_1d0;
  undefined7 local_1c8;
  undefined1 uStack_1c1;
  undefined7 uStack_1c0;
  undefined1 local_1b9;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar16 = 0;
LAB_0010d067:
  do {
    oVar5 = nextChar(this);
  } while (0x11 < uVar16);
  _Var4._M_value =
       oVar5.super__Optional_base<char,_true,_true>._M_payload.super__Optional_payload_base<char>.
       _M_payload;
  switch(uVar16) {
  case 0:
    if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) != 0) {
      uVar14 = (ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                       super__Optional_payload_base<char> & 0xff;
      iVar6 = isspace(uVar14);
      uVar16 = 0;
      if (iVar6 == 0) {
        iVar6 = isprint(uVar14);
        if (iVar6 == 0) goto switchD_0010d276_caseD_22;
        uVar16 = 1;
        if (9 < uVar14 - 0x30) {
          iVar6 = isalpha(uVar14);
          uVar16 = 6;
          if (iVar6 == 0) {
            uVar3 = (ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                            super__Optional_payload_base<char> & 0xff;
            switch(uVar3) {
            case 0x21:
              uVar16 = 0xf;
              break;
            case 0x22:
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x26:
            case 0x27:
            case 0x2e:
            case 0x30:
            case 0x31:
            case 0x32:
            case 0x33:
            case 0x34:
            case 0x35:
            case 0x36:
            case 0x37:
            case 0x38:
            case 0x39:
            case 0x3a:
switchD_0010d276_caseD_22:
              pVar18 = previousPos(this);
              this->_ptr = pVar18;
              plVar11 = (long *)__cxa_allocate_exception(0x28);
              local_1d8 = &local_1c8;
              local_1c8 = 0x64696c61766e49;
              uStack_1c1 = 0x49;
              uStack_1c0 = 0x7272457475706e;
              local_1d0 = 0xf;
              local_1b9 = 0;
              uVar2 = (this->_ptr).first;
              *plVar11 = (long)(plVar11 + 2);
              *(undefined8 *)((long)plVar11 + 0x17) = 0x7272457475706e49;
              plVar11[2] = 0x4964696c61766e49;
              plVar11[1] = 0xf;
              *(undefined1 *)((long)plVar11 + 0x1f) = 0;
              plVar11[4] = uVar2 + 1;
              __cxa_throw(plVar11,&Error::typeinfo,Error::~Error);
            case 0x28:
              uVar16 = 9;
              break;
            case 0x29:
              uVar16 = 10;
              break;
            case 0x2a:
              uVar16 = 5;
              break;
            case 0x2b:
              uVar16 = 2;
              break;
            case 0x2c:
              uVar16 = 0x10;
              break;
            case 0x2d:
              uVar16 = 3;
              break;
            case 0x2f:
              uVar16 = 4;
              break;
            case 0x3b:
              uVar16 = 8;
              break;
            case 0x3c:
              uVar16 = 0xc;
              break;
            case 0x3d:
              uVar16 = 7;
              break;
            case 0x3e:
              uVar16 = 0xb;
              break;
            default:
              if (uVar3 == 0x7b) {
                uVar16 = 0xd;
              }
              else {
                if (uVar3 != 0x7d) goto switchD_0010d276_caseD_22;
                uVar16 = 0xe;
              }
            }
          }
        }
        local_468[0] = _Var4._M_value;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_468,1);
      }
      goto LAB_0010d067;
    }
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = false;
    break;
  case 1:
    if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__cxx11::stringbuf::str();
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_468._4_4_,local_468._0_4_);
      if (paVar15->_M_local_buf[0] == '0') {
        std::__cxx11::stringbuf::str();
        bVar17 = (code *)0x1 < local_440;
        if (local_448 != &local_438) {
          operator_delete(local_448,local_438._M_allocated_capacity + 1);
        }
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_468._4_4_,local_468._0_4_);
      }
      else {
        bVar17 = false;
      }
      if (paVar15 != &local_458) {
        operator_delete(paVar15,local_458._M_allocated_capacity + 1);
      }
      if (bVar17) {
        psVar12 = (string *)__cxa_allocate_exception(0x28);
        local_238 = local_228;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"StartWithZeroErr","");
        uVar2 = (this->_ptr).first;
        *(string **)psVar12 = psVar12 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar12,local_238,local_238 + local_230);
        *(unsigned_long *)(psVar12 + 0x20) = uVar2 + 1;
        __cxa_throw(psVar12,&Error::typeinfo,Error::~Error);
      }
      std::__cxx11::stringbuf::str();
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_468._4_4_,local_468._0_4_);
      piVar9 = __errno_location();
      local_424 = *piVar9;
      *piVar9 = 0;
      uVar10 = strtol(paVar15->_M_local_buf,(char **)&local_448,10);
      if (local_448 == paVar15) {
        std::__throw_invalid_argument("stoi");
      }
      else if (((long)(int)uVar10 == uVar10) && (*piVar9 != 0x22)) {
        if (*piVar9 == 0) {
          *piVar9 = local_424;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_468._4_4_,local_468._0_4_) != &local_458) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_468._4_4_,local_468._0_4_),
                          local_458._M_allocated_capacity + 1);
        }
        local_458._8_8_ = (this->_ptr).first + 1;
        local_468._0_4_ = UNSIGNED_INTEGER;
        local_458._M_allocated_capacity = uVar10 & 0xffffffff;
        local_468._8_8_ = std::any::_Manager_internal<int>::_S_manage;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = UNSIGNED_INTEGER;
        std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>).
                       _M_payload.super__Optional_payload<Token,_true,_false,_false>.
                       super__Optional_payload_base<Token>._M_payload._M_value._value,
                      (any *)(local_468 + 8));
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_458._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if ((code *)local_468._8_8_ != (code *)0x0) {
          (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
        }
        break;
      }
      std::__throw_out_of_range("stoi");
LAB_0010e875:
      psVar12 = (string *)__cxa_allocate_exception(0x28);
      local_298 = local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"StartWithZeroErr","");
      uVar2 = (this->_ptr).first;
      *(string **)psVar12 = psVar12 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar12,local_298,local_298 + local_290);
      *(unsigned_long *)(psVar12 + 0x20) = uVar2 + 1;
      __cxa_throw(psVar12,&Error::typeinfo,Error::~Error);
    }
    if (9 < ((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                     super__Optional_payload_base<char> & 0xff) - 0x30) {
      iVar6 = isalpha((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                              super__Optional_payload_base<char> & 0xff);
      if (iVar6 == 0) {
        pVar18 = previousPos(this);
        this->_ptr = pVar18;
        std::__cxx11::stringbuf::str();
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_468._4_4_,local_468._0_4_);
        if (paVar15->_M_local_buf[0] == '0') {
          std::__cxx11::stringbuf::str();
          bVar17 = (code *)0x1 < local_440;
          if (local_448 != &local_438) {
            operator_delete(local_448,local_438._M_allocated_capacity + 1);
          }
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_468._4_4_,local_468._0_4_);
        }
        else {
          bVar17 = false;
        }
        if (paVar15 != &local_458) {
          operator_delete(paVar15,local_458._M_allocated_capacity + 1);
        }
        if (!bVar17) {
          std::__cxx11::stringbuf::str();
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_468._4_4_,local_468._0_4_);
          piVar9 = __errno_location();
          local_424 = *piVar9;
          *piVar9 = 0;
          uVar10 = strtol(paVar15->_M_local_buf,(char **)&local_448,10);
          if (local_448 == paVar15) {
            std::__throw_invalid_argument("stoi");
          }
          else if (((long)(int)uVar10 == uVar10) && (*piVar9 != 0x22)) {
            if (*piVar9 == 0) {
              *piVar9 = local_424;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_468._4_4_,local_468._0_4_) != &local_458) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_468._4_4_,local_468._0_4_),
                              local_458._M_allocated_capacity + 1);
            }
            local_458._8_8_ = (this->_ptr).first + 1;
            local_468._0_4_ = UNSIGNED_INTEGER;
            local_458._M_allocated_capacity = uVar10 & 0xffffffff;
            local_468._8_8_ = std::any::_Manager_internal<int>::_S_manage;
            (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_payload._M_value._type = UNSIGNED_INTEGER;
            std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>).
                           _M_payload.super__Optional_payload<Token,_true,_false,_false>.
                           super__Optional_payload_base<Token>._M_payload._M_value._value,
                          (any *)(local_468 + 8));
            (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_payload._M_value._lineNumber = local_458._8_8_;
            (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_engaged = true;
            if ((code *)local_468._8_8_ != (code *)0x0) {
              (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
            }
            break;
          }
          uVar13 = std::__throw_out_of_range("stoi");
          __clang_call_terminate(uVar13);
        }
        goto LAB_0010e875;
      }
      local_468[0] = _Var4._M_value;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_468,1);
      std::__cxx11::stringbuf::str();
      if ((code *)local_468._8_8_ == (code *)0x2) goto code_r0x0010d228;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_468._4_4_,local_468._0_4_) != &local_458) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_468._4_4_,local_468._0_4_),
                        local_458._M_allocated_capacity + 1);
      }
      goto LAB_0010e6c2;
    }
    local_468[0] = _Var4._M_value;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_468,1);
    uVar16 = 1;
    goto LAB_0010d067;
  case 2:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = PLUS_SIGN;
    local_458._M_allocated_capacity = 0x2b;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = PLUS_SIGN;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 3:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = MINUS_SIGN;
    local_458._M_allocated_capacity = 0x2d;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = MINUS_SIGN;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 4:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = DIVISION_SIGN;
    local_458._M_allocated_capacity = 0x2f;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = DIVISION_SIGN;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 5:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = MULTIPLICATION_SIGN;
    local_458._M_allocated_capacity = 0x2a;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = MULTIPLICATION_SIGN;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 6:
    if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__cxx11::stringbuf::str();
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&ReservedWords_abi_cxx11_._M_t,(key_type *)local_468);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &ReservedWords_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        local_3b8 = std::any::
                    _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::_S_manage;
        local_3b0._M_ptr = (void *)0x0;
        std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                  (&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468);
        uVar2 = (this->_ptr).first;
        local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_448._4_4_,2);
        local_438._M_allocated_capacity = 0;
        if (local_3b8 == (code *)0x0) {
          local_440 = (code *)0x0;
          TVar7 = IDENTIFIER;
        }
        else {
          local_420._M_obj = &local_440;
          (*local_3b8)(2,&local_3b8);
          TVar7 = (TokenType)local_448;
        }
        local_438._8_8_ = uVar2 + 1;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = TVar7;
        std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>).
                       _M_payload.super__Optional_payload<Token,_true,_false,_false>.
                       super__Optional_payload_base<Token>._M_payload._M_value._value,
                      (any *)&local_440);
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_438._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if (local_440 != (code *)0x0) {
          (*local_440)(3,&local_440,0);
          local_440 = (code *)0x0;
        }
        if (local_3b8 != (code *)0x0) {
          (*local_3b8)(3,&local_3b8,0);
          local_3b8 = (code *)0x0;
        }
      }
      else {
        local_3a8 = std::any::
                    _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::_S_manage;
        local_3a0[0]._M_ptr = (void *)0x0;
        std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                  (local_3a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468);
        uVar2 = (this->_ptr).first;
        local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_448._4_4_,3);
        local_438._M_allocated_capacity = 0;
        if (local_3a8 == (code *)0x0) {
          local_440 = (code *)0x0;
          TVar7 = RESERVED_WORD;
        }
        else {
          local_420._M_obj = &local_440;
          (*local_3a8)(2,&local_3a8);
          TVar7 = (TokenType)local_448;
        }
        local_438._8_8_ = uVar2 + 1;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = TVar7;
        std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>).
                       _M_payload.super__Optional_payload<Token,_true,_false,_false>.
                       super__Optional_payload_base<Token>._M_payload._M_value._value,
                      (any *)&local_440);
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_438._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if (local_440 != (code *)0x0) {
          (*local_440)(3,&local_440,0);
          local_440 = (code *)0x0;
        }
        if (local_3a8 != (code *)0x0) {
          (*local_3a8)(3,&local_3a8,0);
          local_3a8 = (code *)0x0;
        }
      }
    }
    else {
      iVar6 = isalpha((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                              super__Optional_payload_base<char> & 0xff);
      if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                   super__Optional_payload_base<char> & 0xff) - 0x30 < 10 || iVar6 != 0) {
        local_468[0] = _Var4._M_value;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_468,1);
        uVar16 = 6;
        goto LAB_0010d067;
      }
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      std::__cxx11::stringbuf::str();
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&ReservedWords_abi_cxx11_._M_t,(key_type *)local_468);
      if ((_Rb_tree_header *)iVar8._M_node ==
          &ReservedWords_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        local_3d8 = std::any::
                    _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::_S_manage;
        local_3d0._M_ptr = (void *)0x0;
        std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                  (&local_3d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468);
        uVar2 = (this->_ptr).first;
        local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_448._4_4_,2);
        local_438._M_allocated_capacity = 0;
        if (local_3d8 == (code *)0x0) {
          local_440 = (code *)0x0;
          TVar7 = IDENTIFIER;
        }
        else {
          local_420._M_obj = &local_440;
          (*local_3d8)(2,&local_3d8);
          TVar7 = (TokenType)local_448;
        }
        local_438._8_8_ = uVar2 + 1;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = TVar7;
        std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>).
                       _M_payload.super__Optional_payload<Token,_true,_false,_false>.
                       super__Optional_payload_base<Token>._M_payload._M_value._value,
                      (any *)&local_440);
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_438._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if (local_440 != (code *)0x0) {
          (*local_440)(3,&local_440,0);
          local_440 = (code *)0x0;
        }
        if (local_3d8 != (code *)0x0) {
          (*local_3d8)(3,&local_3d8,0);
          local_3d8 = (code *)0x0;
        }
      }
      else {
        local_3c8 = std::any::
                    _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::_S_manage;
        local_3c0._M_ptr = (void *)0x0;
        std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string&>
                  (&local_3c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468);
        uVar2 = (this->_ptr).first;
        local_448 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_448._4_4_,3);
        local_438._M_allocated_capacity = 0;
        if (local_3c8 == (code *)0x0) {
          local_440 = (code *)0x0;
          TVar7 = RESERVED_WORD;
        }
        else {
          local_420._M_obj = &local_440;
          (*local_3c8)(2,&local_3c8);
          TVar7 = (TokenType)local_448;
        }
        local_438._8_8_ = uVar2 + 1;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type = TVar7;
        std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>).
                       _M_payload.super__Optional_payload<Token,_true,_false,_false>.
                       super__Optional_payload_base<Token>._M_payload._M_value._value,
                      (any *)&local_440);
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._lineNumber = local_438._8_8_;
        (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_engaged = true;
        if (local_440 != (code *)0x0) {
          (*local_440)(3,&local_440,0);
          local_440 = (code *)0x0;
        }
        if (local_3c8 != (code *)0x0) {
          (*local_3c8)(3,&local_3c8,0);
          local_3c8 = (code *)0x0;
        }
      }
    }
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_468._4_4_,local_468._0_4_);
    uVar13 = local_458._M_allocated_capacity;
    if (paVar15 == &local_458) break;
    goto LAB_0010dbe6;
  case 7:
    if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    if (_Var4._M_value != 0x3d) {
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_458._8_8_ = pVar18.first + 1;
      local_468._0_4_ = ASSIGNMENT_SIGN;
      local_458._M_allocated_capacity = 0x3d;
      local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = ASSIGNMENT_SIGN;
      std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                     super__Optional_payload<Token,_true,_false,_false>.
                     super__Optional_payload_base<Token>._M_payload._M_value._value,
                    (any *)(local_468 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_458._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_468._8_8_ != (code *)0x0) {
        (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
      }
      break;
    }
    local_438._M_allocated_capacity._0_3_ = 0x3d3d;
    local_3e8._M_manager =
         std::any::
         _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::_S_manage;
    local_3e8._M_storage._M_ptr = (void *)0x0;
    local_3e8._M_storage._M_ptr = operator_new(0x20);
    local_448 = &local_438;
    *(long **)local_3e8._M_storage._M_ptr = (long *)((long)local_3e8._M_storage._M_ptr + 0x10);
    *(size_type *)((long)local_3e8._M_storage._M_ptr + 0x10) = local_438._M_allocated_capacity;
    *(undefined8 *)((long)local_3e8._M_storage._M_ptr + 0x18) = local_438._8_8_;
    *(long *)((long)local_3e8._M_storage._M_ptr + 8) = 2;
    local_440 = (code *)0x0;
    local_438._M_allocated_capacity = local_438._M_allocated_capacity & 0xffffffffffffff00;
    uVar2 = (this->_ptr).first;
    _Var1._M_obj = local_468 + 8;
    local_468._0_4_ = EQUAL_SIGN;
    local_458._M_allocated_capacity = 0;
    local_420._M_obj = _Var1._M_obj;
    std::any::
    _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_S_manage(_Op_clone,&local_3e8,&local_420);
    local_458._8_8_ = uVar2 + 1;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = local_468._0_4_;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,_Var1._M_any);
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)_Var1._M_obj,(_Arg *)0x0);
      local_468._8_8_ = (code *)0x0;
    }
    if (local_3e8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_3e8._M_manager)(_Op_destroy,&local_3e8,(_Arg *)0x0);
      local_3e8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    goto LAB_0010dbd7;
  case 8:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = SEMICOLON;
    local_458._M_allocated_capacity = 0x3b;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = SEMICOLON;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 9:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = LEFT_BRACKET;
    local_458._M_allocated_capacity = 0x28;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = LEFT_BRACKET;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 10:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = RIGHT_BRACKET;
    local_458._M_allocated_capacity = 0x29;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = RIGHT_BRACKET;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 0xb:
    if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    if (_Var4._M_value != 0x3d) {
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_458._8_8_ = pVar18.first + 1;
      local_468._0_4_ = GREATER_THAN_SIGH;
      local_458._M_allocated_capacity = 0x7b;
      local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = GREATER_THAN_SIGH;
      std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                     super__Optional_payload<Token,_true,_false,_false>.
                     super__Optional_payload_base<Token>._M_payload._M_value._value,
                    (any *)(local_468 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_458._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_468._8_8_ != (code *)0x0) {
        (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
      }
      break;
    }
    local_438._M_allocated_capacity._0_3_ = 0x3d3e;
    local_3f8._M_manager =
         std::any::
         _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::_S_manage;
    local_3f8._M_storage._M_ptr = (void *)0x0;
    local_3f8._M_storage._M_ptr = operator_new(0x20);
    local_448 = &local_438;
    *(long **)local_3f8._M_storage._M_ptr = (long *)((long)local_3f8._M_storage._M_ptr + 0x10);
    *(size_type *)((long)local_3f8._M_storage._M_ptr + 0x10) = local_438._M_allocated_capacity;
    *(undefined8 *)((long)local_3f8._M_storage._M_ptr + 0x18) = local_438._8_8_;
    *(long *)((long)local_3f8._M_storage._M_ptr + 8) = 2;
    local_440 = (code *)0x0;
    local_438._M_allocated_capacity = local_438._M_allocated_capacity & 0xffffffffffffff00;
    uVar2 = (this->_ptr).first;
    _Var1._M_obj = local_468 + 8;
    local_468._0_4_ = GREATER_THAN_EQUAL_SIGH;
    local_458._M_allocated_capacity = 0;
    local_420._M_obj = _Var1._M_obj;
    std::any::
    _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_S_manage(_Op_clone,&local_3f8,&local_420);
    local_458._8_8_ = uVar2 + 1;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = local_468._0_4_;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,_Var1._M_any);
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)_Var1._M_obj,(_Arg *)0x0);
      local_468._8_8_ = (code *)0x0;
    }
    if (local_3f8._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_3f8._M_manager)(_Op_destroy,&local_3f8,(_Arg *)0x0);
      local_3f8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    goto LAB_0010dbd7;
  case 0xc:
    if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    if (_Var4._M_value != 0x3d) {
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      local_458._8_8_ = pVar18.first + 1;
      local_468._0_4_ = LESS_THAN_SIGH;
      local_458._M_allocated_capacity = 0x3c;
      local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = LESS_THAN_SIGH;
      std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                     super__Optional_payload<Token,_true,_false,_false>.
                     super__Optional_payload_base<Token>._M_payload._M_value._value,
                    (any *)(local_468 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_458._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_468._8_8_ != (code *)0x0) {
        (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
      }
      break;
    }
    local_438._M_allocated_capacity._0_3_ = 0x3d3c;
    local_408._M_manager =
         std::any::
         _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::_S_manage;
    local_408._M_storage._M_ptr = (void *)0x0;
    local_408._M_storage._M_ptr = operator_new(0x20);
    local_448 = &local_438;
    *(long **)local_408._M_storage._M_ptr = (long *)((long)local_408._M_storage._M_ptr + 0x10);
    *(size_type *)((long)local_408._M_storage._M_ptr + 0x10) = local_438._M_allocated_capacity;
    *(undefined8 *)((long)local_408._M_storage._M_ptr + 0x18) = local_438._8_8_;
    *(long *)((long)local_408._M_storage._M_ptr + 8) = 2;
    local_440 = (code *)0x0;
    local_438._M_allocated_capacity = local_438._M_allocated_capacity & 0xffffffffffffff00;
    uVar2 = (this->_ptr).first;
    _Var1._M_obj = local_468 + 8;
    local_468._0_4_ = LESS_THAN_EQUAL_SIGH;
    local_458._M_allocated_capacity = 0;
    local_420._M_obj = _Var1._M_obj;
    std::any::
    _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_S_manage(_Op_clone,&local_408,&local_420);
    local_458._8_8_ = uVar2 + 1;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = local_468._0_4_;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,_Var1._M_any);
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)_Var1._M_obj,(_Arg *)0x0);
      local_468._8_8_ = (code *)0x0;
    }
    if (local_408._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_408._M_manager)(_Op_destroy,&local_408,(_Arg *)0x0);
      local_408._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
    goto LAB_0010dbd7;
  case 0xd:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = LEFT_BRACE;
    local_458._M_allocated_capacity = 0x7b;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = LEFT_BRACE;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 0xe:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = RIGHT_BRACE;
    local_458._M_allocated_capacity = 0x7d;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = RIGHT_BRACE;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 0xf:
    if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    if (_Var4._M_value != 0x3d) {
      plVar11 = (long *)__cxa_allocate_exception(0x28);
      local_218 = &local_208;
      local_208 = 0x64696c61766e49;
      uStack_201 = 0x49;
      uStack_200 = 0x7272457475706e;
      local_210 = 0xf;
      local_1f9 = 0;
      uVar2 = (this->_ptr).first;
      *plVar11 = (long)(plVar11 + 2);
      *(undefined8 *)((long)plVar11 + 0x17) = 0x7272457475706e49;
      plVar11[2] = 0x4964696c61766e49;
      plVar11[1] = 0xf;
      *(undefined1 *)((long)plVar11 + 0x1f) = 0;
      plVar11[4] = uVar2 + 1;
      __cxa_throw(plVar11,&Error::typeinfo,Error::~Error);
    }
    local_438._M_allocated_capacity._0_3_ = 0x3d21;
    local_418._M_manager =
         std::any::
         _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::_S_manage;
    local_418._M_storage._M_ptr = (void *)0x0;
    local_418._M_storage._M_ptr = operator_new(0x20);
    local_448 = &local_438;
    *(long **)local_418._M_storage._M_ptr = (long *)((long)local_418._M_storage._M_ptr + 0x10);
    *(size_type *)((long)local_418._M_storage._M_ptr + 0x10) = local_438._M_allocated_capacity;
    *(undefined8 *)((long)local_418._M_storage._M_ptr + 0x18) = local_438._8_8_;
    *(long *)((long)local_418._M_storage._M_ptr + 8) = 2;
    local_440 = (code *)0x0;
    local_438._M_allocated_capacity = local_438._M_allocated_capacity & 0xffffffffffffff00;
    uVar2 = (this->_ptr).first;
    _Var1._M_obj = local_468 + 8;
    local_468._0_4_ = UNEQUAL_SIGN;
    local_458._M_allocated_capacity = 0;
    local_420._M_obj = _Var1._M_obj;
    std::any::
    _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_S_manage(_Op_clone,&local_418,&local_420);
    local_458._8_8_ = uVar2 + 1;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = local_468._0_4_;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,_Var1._M_any);
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)_Var1._M_obj,(_Arg *)0x0);
      local_468._8_8_ = (code *)0x0;
    }
    if (local_418._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      (*local_418._M_manager)(_Op_destroy,&local_418,(_Arg *)0x0);
      local_418._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    }
LAB_0010dbd7:
    uVar13 = local_438._M_allocated_capacity;
    paVar15 = local_448;
    if (local_448 != &local_438) {
LAB_0010dbe6:
      operator_delete(paVar15,uVar13 + 1);
    }
    break;
  case 0x10:
    pVar18 = previousPos(this);
    this->_ptr = pVar18;
    local_458._8_8_ = pVar18.first + 1;
    local_468._0_4_ = COMMA_SIGH;
    local_458._M_allocated_capacity = 0x2c;
    local_468._8_8_ = std::any::_Manager_internal<char>::_S_manage;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._type = COMMA_SIGH;
    std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value,
                  (any *)(local_468 + 8));
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_payload._M_value._lineNumber = local_458._8_8_;
    (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
    super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
    _M_engaged = true;
    if ((code *)local_468._8_8_ != (code *)0x0) {
      (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
    }
    break;
  case 0x11:
    if (((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                 super__Optional_payload_base<char> >> 8 & 1) == 0) {
      std::__cxx11::stringbuf::str();
      local_458._M_allocated_capacity._0_4_ = htoi(local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8[0]._M_dataplus._M_p != &local_2f8[0].field_2) {
        operator_delete(local_2f8[0]._M_dataplus._M_p,local_2f8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_458._8_8_ = (this->_ptr).first + 1;
      local_468._0_4_ = UNSIGNED_INTEGER;
      local_458._M_allocated_capacity._4_4_ = 0;
      local_468._8_8_ = std::any::_Manager_internal<int>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = UNSIGNED_INTEGER;
      std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                     super__Optional_payload<Token,_true,_false,_false>.
                     super__Optional_payload_base<Token>._M_payload._M_value._value,
                    (any *)(local_468 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_458._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_468._8_8_ != (code *)0x0) {
        (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
      }
    }
    else {
      if (((byte)(_Var4._M_value + 0xbfU) < 0x26 || (byte)(_Var4._M_value + 0x9fU) < 6) ||
          ((ushort)oVar5.super__Optional_base<char,_true,_true>._M_payload.
                   super__Optional_payload_base<char> & 0xfe) - 0x30 < 10) {
        local_468[0] = _Var4._M_value;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_468,1);
        uVar16 = 0x11;
        goto LAB_0010d067;
      }
      pVar18 = previousPos(this);
      this->_ptr = pVar18;
      std::__cxx11::stringbuf::str();
      local_458._M_allocated_capacity._0_4_ = htoi(local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358[0]._M_dataplus._M_p != &local_358[0].field_2) {
        operator_delete(local_358[0]._M_dataplus._M_p,local_358[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_458._8_8_ = (this->_ptr).first + 1;
      local_468._0_4_ = UNSIGNED_INTEGER;
      local_458._M_allocated_capacity._4_4_ = 0;
      local_468._8_8_ = std::any::_Manager_internal<int>::_S_manage;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type = UNSIGNED_INTEGER;
      std::any::any(&(__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
                     super__Optional_payload<Token,_true,_false,_false>.
                     super__Optional_payload_base<Token>._M_payload._M_value._value,
                    (any *)(local_468 + 8));
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._lineNumber = local_458._8_8_;
      (__return_storage_ptr__->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged = true;
      if ((code *)local_468._8_8_ != (code *)0x0) {
        (*(code *)local_468._8_8_)(_Op_destroy,(any *)(local_468 + 8),(_Arg *)0x0);
      }
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
code_r0x0010d228:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_468._4_4_,local_468._0_4_) != &local_458) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_468._4_4_,local_468._0_4_),local_458._M_allocated_capacity + 1
                   );
  }
  uVar16 = 0x11;
  if ((_Var4._M_value & 0xdfU) != 0x58) {
LAB_0010e6c2:
    plVar11 = (long *)__cxa_allocate_exception(0x28);
    local_1f8 = &local_1e8;
    local_1e8 = 0x64696c61766e49;
    uStack_1e1 = 0x49;
    uStack_1e0 = 0x7272457475706e;
    local_1f0 = 0xf;
    local_1d9 = 0;
    uVar2 = (this->_ptr).first;
    *plVar11 = (long)(plVar11 + 2);
    *(undefined8 *)((long)plVar11 + 0x17) = 0x7272457475706e49;
    plVar11[2] = 0x4964696c61766e49;
    plVar11[1] = 0xf;
    *(undefined1 *)((long)plVar11 + 0x1f) = 0;
    plVar11[4] = uVar2 + 1;
    __cxa_throw(plVar11,&Error::typeinfo,Error::~Error);
  }
  goto LAB_0010d067;
}

Assistant:

std::optional<Token> Tokenizer::nextToken() {
	std::stringstream ss;
	DFAState current_state = DFAState::INITIAL_STATE;
	while (true) {
		auto current_char = nextChar();
		switch (current_state)
		{
		case DFAState::INITIAL_STATE: {
			//�����ļ�β
			if (!current_char.has_value()) {
				return {};
			}

			auto ch = current_char.value();
			// �����Ƿ������˲��Ϸ����ַ�����ʼ��Ϊ��
			auto invalid = false;

			if (miniplc0::isspace(ch)) // �������ַ��ǿհ��ַ����ո񡢻��С��Ʊ����ȣ�
				current_state = DFAState::INITIAL_STATE;
			else if (!miniplc0::isprint(ch)) // control codes and backspace
				invalid = true;
			else if (miniplc0::isdigit(ch))
				current_state = DFAState::UNSIGNED_INTEGER_STATE;
			else if (miniplc0::isalpha(ch))
				current_state = DFAState::IDENTIFIER_STATE;
			else {
				switch (ch) {
				case '=':
					current_state = DFAState::EQUAL_SIGN_STATE;
					break;
				case '-':
					current_state = DFAState::MINUS_SIGN_STATE;
					break;
				case '+':
					current_state = DFAState::PLUS_SIGN_STATE;
					break;
				case '*':
					current_state = DFAState::MULTIPLICATION_SIGN_STATE;
					break;
				case '/':
					current_state = DFAState::DIVISION_SIGN_STATE;
					break;
				case ';':
					current_state = DFAState::SEMICOLON_STATE;
					break;
				case '(':
					current_state = DFAState::LEFTBRACKET_STATE;
					break;
				case ')':
					current_state = DFAState::RIGHTBRACKET_STATE;
					break;

					//��min0�Ļ�����������6��״̬
				case '>':
					current_state = DFAState::GREATER_THAN_STATE;
					break;
				case '<':
					current_state = DFAState::LESS_THAN_STATE;
					break;
				case '{':
					current_state = DFAState::LEFTBRACE_STATE;
					break;
				case '}':
					current_state = DFAState::RIGHTBRACE_STATE;
					break;
				case '!':
					current_state = DFAState::EXCLAMATION_SIGH_STATE;
					break;
				case ',':
					current_state = DFAState::COMMA_STATE;
					break;

					// �����ܵ��ַ����µĲ��Ϸ���״̬
				default:
					invalid = true;
					break;
				}
			}
			if (invalid) {
				unreadLast();
				throw Error("InvalidInputErr", _ptr.first + 1);
			}
			// �����������ַ�������״̬��ת�ƣ�˵������һ��token�ĵ�һ���ַ�
			if (current_state != DFAState::INITIAL_STATE) // ignore white spaces
				ss << ch; // �洢�������ַ�
			break;
		}
		case DFAState::UNSIGNED_INTEGER_STATE: {
			// ������ǰ�Ѿ��������ļ�β���������Ѿ��������ַ���Ϊ����
			//     �����ɹ��򷵻��޷����������͵�token�����򷵻ر�������
			// �����������ַ������֣����洢�������ַ�
			// ��������������ĸ�������Ƿ�Ϊx�Լ�����λ�÷���ʮ����������תΪʮ��������״̬��������������
			// �����������ַ�������������֮һ�������˶������ַ����������Ѿ��������ַ���Ϊ����
			//     �����ɹ��򷵻��޷����������͵�token�����򷵻ر�������
			if (!current_char.has_value()) {
				if (ss.str()[0] == '0' && ss.str().size() > 1) {
					throw Error("StartWithZeroErr", _ptr.first + 1);
				}
				try {
					int ret = std::stoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::isdigit(ch)) {
				ss << ch;
			}
			else if (miniplc0::isalpha(ch)) {
				ss << ch;
				if (ss.str().size() == 2 && (ch == 'x' || ch == 'X')) {
					current_state = DFAState::HEXADECIMAL_STATE;
				}
				else {
					throw Error("InvalidInputErr", _ptr.first + 1);
				}
			}
			else {
				unreadLast();
				if (ss.str()[0] == '0' && ss.str().size() > 1) {
					throw Error("StartWithZeroErr", _ptr.first + 1);
				}
				try {
					int ret = std::stoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::HEXADECIMAL_STATE: {
			if (!current_char.has_value()) {
				try {
					int ret = htoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::ishexadecimal(ch)) {
				ss << ch;
			}
			else {
				unreadLast();
				try {
					int ret = htoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::IDENTIFIER_STATE: {
			// ������ǰ�Ѿ��������ļ�β���������Ѿ��������ַ���
			//     �������������ǹؼ��֣���ô���ض�Ӧ�ؼ��ֵ�token�����򷵻ر�ʶ����token
			// �������������ַ�����ĸ�����洢�������ַ�
			// �����������ַ�������������֮һ�������˶������ַ����������Ѿ��������ַ���
			//     �������������ǹؼ��֣���ô���ض�Ӧ�ؼ��ֵ�token�����򷵻ر�ʶ����token

			if (!current_char.has_value()) {
				std::string str = ss.str();
				if (ReservedWords.find(str) != ReservedWords.end()) {
					return Token(TokenType::RESERVED_WORD, str, _ptr.first + 1);
				}
				else {
					return Token(TokenType::IDENTIFIER, str, _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::isalpha(ch) || miniplc0::isdigit(ch)) {
				ss << ch;
			}
			else {
				unreadLast();
				std::string str = ss.str();
				if (ReservedWords.find(str) != ReservedWords.end()) {
					return Token(TokenType::RESERVED_WORD, str, _ptr.first + 1);
				}
				else {
					return Token(TokenType::IDENTIFIER, str, _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::PLUS_SIGN_STATE: {
			unreadLast(); // Yes, we unread last char even if it's an EOF.
			return Token(TokenType::PLUS_SIGN, '+', _ptr.first + 1);
		}
		case DFAState::MINUS_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::MINUS_SIGN, '-', _ptr.first + 1);
		}
		case DFAState::MULTIPLICATION_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::MULTIPLICATION_SIGN, '*', _ptr.first + 1);
		}
		case DFAState::DIVISION_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::DIVISION_SIGN, '/', _ptr.first + 1);
		}
		case DFAState::SEMICOLON_STATE: {
			unreadLast();
			return Token(TokenType::SEMICOLON, ';', _ptr.first + 1);
		}
		case DFAState::LEFTBRACKET_STATE: {
			unreadLast();
			return Token(TokenType::LEFT_BRACKET, '(', _ptr.first + 1);
		}
		case DFAState::RIGHTBRACKET_STATE: {
			unreadLast();
			return Token(TokenType::RIGHT_BRACKET, ')', _ptr.first + 1);
		}

										 //c0�ķ�
		case DFAState::COMMA_STATE: {
			unreadLast();
			return Token(TokenType::COMMA_SIGH, ',', _ptr.first + 1);
		}
		case DFAState::LEFTBRACE_STATE: {
			unreadLast();
			return Token(TokenType::LEFT_BRACE, '{', _ptr.first + 1);
		}
		case DFAState::RIGHTBRACE_STATE: {
			unreadLast();
			return Token(TokenType::RIGHT_BRACE, '}', _ptr.first + 1);
		}
		case DFAState::EQUAL_SIGN_STATE: {
			//= & ==
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::EQUAL_SIGN, std::string("=="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::ASSIGNMENT_SIGN, '=', _ptr.first + 1);
			}
		}
		case DFAState::GREATER_THAN_STATE: {
			//> & >=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::GREATER_THAN_EQUAL_SIGH, std::string(">="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::GREATER_THAN_SIGH, '{', _ptr.first + 1);
			}
		}
		case DFAState::LESS_THAN_STATE: {
			//< & <=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::LESS_THAN_EQUAL_SIGH, std::string("<="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::LESS_THAN_SIGH, '<', _ptr.first + 1);
			}
		}
		case DFAState::EXCLAMATION_SIGH_STATE: {
			//!=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::UNEQUAL_SIGN, std::string("!="), _ptr.first + 1);
			}
			else {
				throw Error("InvalidInputErr", _ptr.first + 1);
			}
		}
		default:
			break;
		}
	}
}